

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

void N_VAbs_ManyVector(N_Vector x,N_Vector z)

{
  sunindextype i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < *x->content; lVar1 = lVar1 + 1) {
    N_VAbs(*(undefined8 *)(*(long *)((long)x->content + 0x10) + lVar1 * 8),
           *(undefined8 *)(*(long *)((long)z->content + 0x10) + lVar1 * 8));
  }
  return;
}

Assistant:

void MVAPPEND(N_VAbs)(N_Vector x, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    N_VAbs(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}